

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O1

int qpdfjob_write_qpdf(qpdfjob_handle j,qpdf_data qpdf)

{
  int iVar1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  QUtil::setLineBuf(_stdout);
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:115:28)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:115:28)>
             ::_M_manager;
  local_38._M_unused._M_object = qpdf;
  iVar1 = wrap_qpdfjob(j,(function<int_(_qpdfjob_handle_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int
qpdfjob_write_qpdf(qpdfjob_handle j, qpdf_data qpdf)
{
    QUtil::setLineBuf(stdout);
    return wrap_qpdfjob(j, [qpdf](qpdfjob_handle jh) {
        jh->j.writeQPDF(*(qpdf->qpdf));
        return jh->j.getExitCode();
    });
}